

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# k_ary_search_set.hpp
# Opt level: O0

void __thiscall
burst::k_ary_search_set<long,std::less<void>>::
fill_node<boost::iterator_range<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>>>
          (k_ary_search_set<long,std::less<void>> *this,k_ary_search_set_branch *branch,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *counters,
          iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
          *range)

{
  pointer puVar1;
  long lVar2;
  difference_type dVar3;
  bool bVar4;
  size_type sVar5;
  const_reference pvVar6;
  reference plVar7;
  reference pvVar8;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_58;
  long *local_50;
  __normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_> local_48;
  long *local_40;
  long local_38;
  difference_type index_in_initial_range;
  size_t element_index;
  iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
  *range_local;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *counters_local;
  k_ary_search_set_branch *branch_local;
  k_ary_search_set<long,_std::less<void>_> *this_local;
  
  index_in_initial_range = 0;
  element_index = (size_t)range;
  range_local = (iterator_range<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>_>
                 *)counters;
  counters_local = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)branch;
  branch_local = (k_ary_search_set_branch *)this;
  while( true ) {
    dVar3 = index_in_initial_range;
    sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                      ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)range_local);
    if (sVar5 - 1 <= (ulong)dVar3) break;
    puVar1 = counters_local[1].super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pvVar6 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)range_local,
                        index_in_initial_range);
    local_38 = (long)puVar1 + *pvVar6;
    plVar7 = boost::iterator_range_detail::
             iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
             ::operator[]((iterator_range_base<__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>,_boost::iterators::random_access_traversal_tag>
                           *)element_index,local_38);
    lVar2 = *plVar7;
    pvVar8 = std::vector<long,_std::allocator<long>_>::operator[]
                       ((vector<long,_std::allocator<long>_> *)this,
                        (long)(counters_local->
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                              _M_impl.super__Vector_impl_data._M_start + index_in_initial_range);
    *pvVar8 = lVar2;
    index_in_initial_range = index_in_initial_range + 1;
  }
  local_48._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)this);
  local_40 = (long *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                     ::operator+(&local_48,
                                 (difference_type)
                                 (counters_local->
                                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                 _M_impl.super__Vector_impl_data._M_start);
  local_58._M_current =
       (long *)std::vector<long,_std::allocator<long>_>::begin
                         ((vector<long,_std::allocator<long>_> *)this);
  puVar1 = (counters_local->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
           _M_impl.super__Vector_impl_data._M_start;
  sVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)range_local);
  local_50 = (long *)__gnu_cxx::__normal_iterator<long_*,_std::vector<long,_std::allocator<long>_>_>
                     ::operator+(&local_58,(long)puVar1 + (sVar5 - 1));
  bVar4 = std::
          is_sorted<__gnu_cxx::__normal_iterator<long*,std::vector<long,std::allocator<long>>>,std::less<void>>
                    (local_40,local_50);
  if (!bVar4) {
    __assert_fail("std::is_sorted ( m_values.begin() + static_cast<difference_type>(branch.index), m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1), m_compare )"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/container/k_ary_search_set.hpp"
                  ,0x1bc,
                  "void burst::k_ary_search_set<long>::fill_node(const k_ary_search_set_branch &, const std::vector<std::size_t> &, const RandomAccessRange &) [Value = long, Compare = std::less<void>, RandomAccessRange = boost::iterator_range<__gnu_cxx::__normal_iterator<long *, std::vector<long>>>]"
                 );
  }
  return;
}

Assistant:

void
            fill_node
            (
                const k_ary_search_set_branch & branch,
                const std::vector<std::size_t> & counters,
                const RandomAccessRange & range
            )
        {
            for
            (
                std::size_t element_index = 0;
                element_index < counters.size() - 1;
                ++element_index
            )
            {
                using difference_type = typename RandomAccessRange::difference_type;
                const auto index_in_initial_range =
                    static_cast<difference_type>
                    (
                        branch.preceding_elements + counters[element_index]
                    );
                m_values[branch.index + element_index] = range[index_in_initial_range];
            }
            BOOST_ASSERT(std::is_sorted
            (
                m_values.begin() + static_cast<difference_type>(branch.index),
                m_values.begin() + static_cast<difference_type>(branch.index + counters.size() - 1),
                m_compare
            ));
        }